

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessBorderAgent
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  element_type *this_00;
  Value *pVVar4;
  element_type *peVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  anon_class_1_0_00000001 local_8b2;
  v10 local_8b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b0;
  char *local_8a8;
  string local_8a0;
  Error local_880;
  Value local_858;
  anon_class_1_0_00000001 local_80a;
  v10 local_809;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_808;
  char *local_800;
  string local_7f8;
  Error local_7d8;
  Value local_7b0;
  string local_768;
  Value local_748;
  ErrorCode local_6fc;
  Error local_6f8;
  Value local_6d0;
  unsigned_short local_684;
  allocator local_681;
  undefined1 local_680 [4];
  uint16_t locator;
  anon_class_1_0_00000001 local_65a;
  v10 local_659;
  v10 *local_658;
  size_t local_650;
  string local_648;
  Error local_628;
  Value local_600;
  ErrorCode local_5b4;
  Error local_5b0;
  Value local_588;
  undefined1 local_540 [8];
  CommissionerAppPtr commissioner;
  string local_528;
  int local_508;
  ErrorCode local_504;
  BorderAgentHandler local_500;
  Error local_4e0;
  Value local_4b8;
  ErrorCode local_46c;
  Error local_468;
  Value local_440;
  allocator local_3f1;
  undefined1 local_3f0 [8];
  string netIf;
  uint64_t timeout;
  string local_3c0;
  anon_class_1_0_00000001 local_38a;
  v10 local_389;
  v10 *local_388;
  size_t local_380;
  string local_378;
  Error local_358;
  Value local_330;
  byte local_2e1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2e0;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  ulong local_298;
  v10 *local_290;
  size_t sStack_288;
  string *local_280;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_278 [3];
  undefined1 local_260 [16];
  v10 *local_250;
  ulong local_248;
  v10 *local_240;
  size_t sStack_238;
  string *local_230;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_228 [2];
  undefined1 local_218 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  char *local_200;
  const_reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f0;
  char *pcStack_1e8;
  string *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  char *local_1a8;
  const_reference local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  char *pcStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_158;
  v10 *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_100;
  undefined1 *local_f8;
  Value **local_f0;
  undefined1 *local_e8;
  Value **local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d8;
  Value **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *pcStack_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_40;
  undefined1 *local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_2e1 = 0;
  local_2e0 = aExpr;
  aExpr_local = (Expression *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_2e0);
  if (sVar2 < 2) {
    ProcessBorderAgent::anon_class_1_0_00000001::operator()(&local_38a);
    local_178 = &local_388;
    local_180 = &local_389;
    bVar6 = ::fmt::v10::operator()(local_180);
    local_380 = bVar6.size_;
    local_388 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_230 = &local_378;
    local_240 = local_388;
    sStack_238 = local_380;
    local_140 = &local_240;
    local_250 = local_388;
    local_248 = local_380;
    local_138 = local_250;
    sStack_130 = local_248;
    local_278[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_f8 = local_260;
    local_100 = local_278;
    local_b0 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_248;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_100;
    local_d8 = local_100;
    local_b8 = local_100;
    local_a8 = local_f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_378,local_250,fmt,args);
    Error::Error(&local_358,kInvalidArgs,&local_378);
    Value::Value(&local_330,&local_358);
    Value::operator=(__return_storage_ptr__,&local_330);
    Value::~Value(&local_330);
    Error::~Error(&local_358);
    std::__cxx11::string::~string((string *)&local_378);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_2e0,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3c0,"discover",(allocator *)((long)&timeout + 7));
    bVar1 = CaseInsensitiveEqual(pvVar3,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&timeout + 7));
    if (bVar1) {
      netIf.field_2._8_8_ = 4000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_3f0,"",&local_3f1);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_2e0);
      if (sVar2 < 3) {
LAB_002498ec:
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_2e0);
        if (sVar2 == 4) {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_2e0,3);
          std::__cxx11::string::operator=((string *)local_3f0,(string *)pvVar3);
        }
        std::function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>::
        function<void(&)(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&),void>
                  ((function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>
                    *)&local_500,BorderAgentHandler);
        DiscoverBorderAgent(&local_4e0,&local_500,netIf.field_2._8_8_,(string *)local_3f0);
        Value::Value(&local_4b8,&local_4e0);
        pVVar4 = Value::operator=(__return_storage_ptr__,&local_4b8);
        local_504 = kNone;
        bVar1 = Value::operator!=(pVVar4,&local_504);
        Value::~Value(&local_4b8);
        Error::~Error(&local_4e0);
        std::function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
        ::~function(&local_500);
        if (bVar1) {
          local_508 = 4;
        }
        else {
          local_508 = 0;
        }
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_2e0,2);
        utils::ParseInteger<unsigned_long>
                  (&local_468,(unsigned_long *)(netIf.field_2._M_local_buf + 8),pvVar3);
        Value::Value(&local_440,&local_468);
        pVVar4 = Value::operator=(__return_storage_ptr__,&local_440);
        local_46c = kNone;
        bVar1 = Value::operator!=(pVVar4,&local_46c);
        Value::~Value(&local_440);
        Error::~Error(&local_468);
        if (!bVar1) goto LAB_002498ec;
        local_508 = 4;
      }
      std::__cxx11::string::~string((string *)local_3f0);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_2e0,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_528,"get",
                 (allocator *)
                 ((long)&commissioner.
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      bVar1 = CaseInsensitiveEqual(pvVar3,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&commissioner.
                         super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi + 7));
      if (!bVar1) {
        ProcessBorderAgent::anon_class_1_0_00000001::operator()(&local_8b2);
        local_148 = &local_8b0;
        local_150 = &local_8b1;
        bVar6 = ::fmt::v10::operator()(local_150);
        local_8a8 = (char *)bVar6.size_;
        local_8b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_1f8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_2e0,1);
        local_1e0 = &local_8a0;
        local_1f0 = local_8b0;
        pcStack_1e8 = local_8a8;
        local_80 = &local_1f0;
        local_208 = local_8b0;
        local_200 = local_8a8;
        local_78 = local_208;
        pcStack_70 = local_200;
        local_228[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_1f8,(v10 *)local_1e0,local_8b0);
        local_38 = local_218;
        local_40 = local_228;
        local_28 = 0xd;
        fmt_02.size_ = 0xd;
        fmt_02.data_ = local_200;
        args_02.field_1.values_ = in_R9.values_;
        args_02.desc_ = (unsigned_long_long)local_40;
        local_30 = local_40;
        local_20 = local_38;
        local_18 = local_40;
        ::fmt::v10::vformat_abi_cxx11_(&local_8a0,(v10 *)local_208,fmt_02,args_02);
        Error::Error(&local_880,kInvalidCommand,&local_8a0);
        Value::Value(&local_858,&local_880);
        Value::operator=(__return_storage_ptr__,&local_858);
        Value::~Value(&local_858);
        Error::~Error(&local_880);
        std::__cxx11::string::~string((string *)&local_8a0);
        goto LAB_0024a5c1;
      }
      std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
                ((shared_ptr<ot::commissioner::CommissionerApp> *)local_540,(nullptr_t)0x0);
      this_00 = std::
                __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mJobManager);
      JobManager::GetSelectedCommissioner(&local_5b0,this_00,(CommissionerAppPtr *)local_540);
      Value::Value(&local_588,&local_5b0);
      pVVar4 = Value::operator=(__return_storage_ptr__,&local_588);
      local_5b4 = kNone;
      bVar1 = Value::operator!=(pVVar4,&local_5b4);
      Value::~Value(&local_588);
      Error::~Error(&local_5b0);
      if (bVar1) {
        local_508 = 4;
      }
      else {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_2e0);
        if (sVar2 < 3) {
          ProcessBorderAgent::anon_class_1_0_00000001::operator()(&local_65a);
          local_168 = &local_658;
          local_170 = &local_659;
          bVar6 = ::fmt::v10::operator()(local_170);
          local_650 = bVar6.size_;
          local_658 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_280 = &local_648;
          local_290 = local_658;
          sStack_288 = local_650;
          local_120 = &local_290;
          local_2a0 = local_658;
          local_298 = local_650;
          local_118 = local_2a0;
          sStack_110 = local_298;
          value = (Value *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_e8 = local_2b0;
          local_f0 = &value;
          local_c8 = 0;
          fmt_00.size_ = 0;
          fmt_00.data_ = (char *)local_298;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_f0;
          local_e0 = local_f0;
          local_d0 = local_f0;
          local_c0 = local_e8;
          ::fmt::v10::vformat_abi_cxx11_(&local_648,local_2a0,fmt_00,args_00);
          Error::Error(&local_628,kInvalidArgs,&local_648);
          Value::Value(&local_600,&local_628);
          Value::operator=(__return_storage_ptr__,&local_600);
          Value::~Value(&local_600);
          Error::~Error(&local_628);
          std::__cxx11::string::~string((string *)&local_648);
          local_508 = 4;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_2e0,2);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_680,"locator",&local_681);
          bVar1 = CaseInsensitiveEqual(pvVar3,(string *)local_680);
          std::__cxx11::string::~string((string *)local_680);
          std::allocator<char>::~allocator((allocator<char> *)&local_681);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x13])
                      (&local_6f8,peVar5,&local_684);
            Value::Value(&local_6d0,&local_6f8);
            pVVar4 = Value::operator=(__return_storage_ptr__,&local_6d0);
            local_6fc = kNone;
            bVar1 = Value::operator!=(pVVar4,&local_6fc);
            Value::~Value(&local_6d0);
            Error::~Error(&local_6f8);
            if (bVar1) {
              local_508 = 4;
              goto LAB_0024a354;
            }
            ToHex<unsigned_short>(&local_768,local_684);
            Value::Value(&local_748,&local_768);
            Value::operator=(__return_storage_ptr__,&local_748);
            Value::~Value(&local_748);
            std::__cxx11::string::~string((string *)&local_768);
          }
          else {
            ProcessBorderAgent::anon_class_1_0_00000001::operator()(&local_80a);
            local_158 = &local_808;
            local_160 = &local_809;
            bVar6 = ::fmt::v10::operator()(local_160);
            local_800 = (char *)bVar6.size_;
            local_808 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        bVar6.data_;
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            local_1a0 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](local_2e0,2);
            local_188 = &local_7f8;
            local_198 = local_808;
            pcStack_190 = local_800;
            local_a0 = &local_198;
            local_1b0 = local_808;
            local_1a8 = local_800;
            local_98 = local_1b0;
            pcStack_90 = local_1a8;
            local_1d8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_1a0,(v10 *)local_188,local_808);
            local_60 = local_1c0;
            local_68 = local_1d8;
            local_50 = 0xd;
            fmt_01.size_ = 0xd;
            fmt_01.data_ = local_1a8;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_68;
            local_58 = local_68;
            local_48 = local_60;
            local_10 = local_68;
            ::fmt::v10::vformat_abi_cxx11_(&local_7f8,(v10 *)local_1b0,fmt_01,args_01);
            Error::Error(&local_7d8,kInvalidArgs,&local_7f8);
            Value::Value(&local_7b0,&local_7d8);
            Value::operator=(__return_storage_ptr__,&local_7b0);
            Value::~Value(&local_7b0);
            Error::~Error(&local_7d8);
            std::__cxx11::string::~string((string *)&local_7f8);
          }
          local_508 = 0;
        }
      }
LAB_0024a354:
      std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
                ((shared_ptr<ot::commissioner::CommissionerApp> *)local_540);
    }
    if ((local_508 != 0) && (local_508 != 4)) goto LAB_0024a5d2;
  }
LAB_0024a5c1:
  local_2e1 = 1;
  local_508 = 1;
LAB_0024a5d2:
  if ((local_2e1 & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBorderAgent(const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "discover"))
    {
        uint64_t    timeout = 4000;
        std::string netIf   = "";

        if (aExpr.size() >= 3)
        {
            SuccessOrExit(value = ParseInteger(timeout, aExpr[2]));
        }

        if (aExpr.size() == 4)
        {
            netIf = aExpr[3];
        }

        SuccessOrExit(value = DiscoverBorderAgent(BorderAgentHandler, static_cast<size_t>(timeout), netIf));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerAppPtr commissioner = nullptr;

        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

        if (CaseInsensitiveEqual(aExpr[2], "locator"))
        {
            uint16_t locator;
            SuccessOrExit(value = commissioner->GetBorderAgentLocator(locator));
            value = ToHex(locator);
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid border agent field", aExpr[2]);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}